

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdD3D56TlvY::emulate_mthd(MthdD3D56TlvY *this)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  byte bVar6;
  
  uVar4 = nv03_pgraph_convert_xy((this->super_SingleMthdTest).super_MthdTest.val);
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  uVar5 = uVar4;
  if (((uVar2 != 0x48) &&
      (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_a & 0x4000) != 0)) &&
     (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dvd_format & 1) != 0)) {
    uVar5 = 0x8000;
    if (-0x7ff9 < (short)uVar4) {
      uVar5 = uVar4 - 8;
    }
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
  *(byte *)puVar1 = (byte)*puVar1 | 0x10;
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_fog_tri_col1;
  *(uint16_t *)
   ((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tlv_xy + 2) = uVar5
  ;
  if (uVar2 == 0x48) {
    bVar6 = (byte)uVar3 & 0xf;
  }
  else {
    bVar6 = (byte)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid;
  *puVar1 = *puVar1 & ~(uint)(1L << (bVar6 & 0x3f));
  return;
}

Assistant:

void emulate_mthd() override {
		uint16_t tv = nv03_pgraph_convert_xy(val);
		if (cls != 0x48 && extr(exp.debug_a, 14, 1) && exp.dvd_format & 1) {
			if (tv >= 0x8000 && tv < 0x8008)
				tv = 0x8000;
			else
				tv -= 8;
		}
		insrt(exp.d3d56_tlv_xy, 16, 16, tv);
		insrt(exp.valid[1], 4, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.d3d56_tlv_fog_tri_col1, 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}